

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  LZ4_stream_t_internal *__src;
  long lVar1;
  char cVar2;
  BYTE *s;
  LZ4_byte *pLVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  char *pcVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  int *piVar17;
  long *plVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  BYTE *e_4;
  char *pcVar22;
  int iVar23;
  BYTE *e_2;
  ulong *puVar24;
  int iVar25;
  ulong *puVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  char *pcVar30;
  long *plVar31;
  ulong *puVar32;
  long *plVar33;
  char cVar34;
  ulong uVar35;
  ulong uVar36;
  int *piVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong *puVar41;
  BYTE *d;
  BYTE *e;
  ulong uVar42;
  ulong uVar43;
  char *pcVar44;
  LZ4_byte *pLVar45;
  long lVar46;
  int iVar47;
  BYTE *e_1;
  int *piVar48;
  bool bVar49;
  U32 *hashTable;
  U32 *hashTable_18;
  ulong *local_f8;
  ulong *local_e8;
  ulong *local_d8;
  long *local_d0;
  ulong *local_c8;
  ulong *local_c0;
  int *local_b8;
  long *local_b0;
  int *local_90;
  int *local_88;
  
  uVar20 = (LZ4_stream->internal_donotuse).dictSize;
  pLVar3 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  iVar21 = 1;
  if (1 < acceleration) {
    iVar21 = acceleration;
  }
  if (0x10000 < iVar21) {
    iVar21 = 0x10001;
  }
  pLVar45 = pLVar3 + uVar20;
  if (pLVar3 + uVar20 != (LZ4_byte *)source &&
      0xfffffffc < (LZ4_stream->internal_donotuse).dictSize - 4) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    pLVar45 = (LZ4_byte *)source;
  }
  pLVar3 = (LZ4_byte *)(source + inputSize);
  if ((LZ4_stream->table[0x801] < pLVar3) && (pLVar3 < pLVar45)) {
    uVar10 = (int)pLVar45 - (int)pLVar3;
    uVar20 = 0x10000;
    if (uVar10 < 0x10000) {
      uVar20 = uVar10;
    }
    uVar42 = 0;
    if (3 < uVar10) {
      uVar42 = (ulong)uVar20;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar42;
    LZ4_stream->table[0x801] = pLVar45 + -uVar42;
  }
  iVar47 = (int)dest;
  if (pLVar45 == (LZ4_byte *)source) {
    uVar20 = (LZ4_stream->internal_donotuse).dictSize;
    uVar42 = (ulong)uVar20;
    if (uVar42 < 0x10000) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar17 = (int *)(ulong)uVar10;
      if (uVar20 < uVar10) {
        if (0x7e000000 < (uint)inputSize) {
          return 0;
        }
        if (inputSize != 0) {
          pcVar30 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          plVar8 = (long *)source;
          if (0xc < inputSize) {
            lVar46 = (long)source - (long)piVar17;
            *(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar10;
            plVar31 = (long *)(source + 1);
            uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
            local_b0 = (long *)dest;
            do {
              uVar28 = 1;
              uVar13 = iVar21 << 6;
              while( true ) {
                plVar33 = (long *)((ulong)uVar28 + (long)plVar31);
                iVar19 = (int)plVar31;
                iVar25 = (int)lVar46;
                if (source + ((ulong)(uint)inputSize - 0xb) < plVar33) {
                  iVar23 = 2;
                }
                else {
                  uVar28 = *(uint *)((long)LZ4_stream + uVar43 * 4);
                  piVar17 = (int *)((ulong)uVar28 + lVar46);
                  uVar4 = (ulong)(*plVar33 * -0x30e4432345000000) >> 0x34;
                  *(int *)((long)LZ4_stream + uVar43 * 4) = iVar19 - iVar25;
                  iVar23 = 8;
                  uVar43 = uVar4;
                  if (((uVar10 - uVar20 <= uVar28) && ((uint)(iVar19 - iVar25) <= uVar28 + 0xffff))
                     && (iVar23 = 7, *piVar17 != (int)*plVar31)) {
                    iVar23 = 0;
                  }
                }
                if ((iVar23 != 0) && (iVar23 != 8)) break;
                uVar28 = uVar13 >> 6;
                uVar13 = uVar13 + 1;
                plVar31 = plVar33;
              }
              if (iVar23 == 7) {
                iVar23 = 0;
              }
              plVar33 = local_b0;
              if (iVar23 == 0) {
                uVar28 = iVar19 - (int)plVar8;
                lVar29 = 0;
                cVar2 = (char)plVar31 * '\x10' + (char)plVar8 * -0x10;
                uVar13 = uVar28 - 0xf;
                do {
                  uVar27 = uVar13;
                  cVar34 = cVar2;
                  lVar39 = lVar29;
                  piVar37 = (int *)((long)piVar17 + lVar39);
                  plVar9 = (long *)((long)plVar31 + lVar39);
                  if ((piVar37 <= source + -uVar42) || (plVar9 <= plVar8)) break;
                  lVar29 = lVar39 + -1;
                  cVar2 = cVar34 + -0x10;
                  uVar13 = uVar27 - 1;
                } while (*(char *)((long)plVar31 + lVar39 + -1) ==
                         *(char *)((long)piVar17 + lVar39 + -1));
                iVar23 = (int)lVar39;
                uVar4 = (ulong)(uint)(iVar23 + (iVar19 - (int)plVar8));
                plVar33 = (long *)((long)local_b0 + 1);
                pcVar22 = (char *)((long)local_b0 +
                                  ((ulong)uVar28 + lVar39 & 0xffffffff) / 0xff + uVar4 + 9);
                if (pcVar30 < pcVar22) {
                  iVar23 = 1;
                }
                else {
                  if ((uint)((ulong)uVar28 + lVar39) < 0xf) {
                    *(char *)local_b0 = cVar34;
                    plVar31 = plVar33;
                  }
                  else {
                    uVar40 = (ulong)(uVar28 - 0xf) + lVar39;
                    *(char *)local_b0 = -0x10;
                    if (0xfe < (int)uVar40) {
                      if (0x1fc < (int)uVar27) {
                        uVar27 = 0x1fd;
                      }
                      uVar13 = (uVar28 - uVar27) + iVar23 + 0xef;
                      uVar40 = (ulong)uVar13 / 0xff;
                      memset(plVar33,0xff,(ulong)(uVar13 / 0xff + 1));
                      plVar33 = (long *)((long)local_b0 + uVar40 + 2);
                      uVar40 = (ulong)((uVar28 - 0x10e) + iVar23 + (int)uVar40 * -0xff);
                    }
                    *(char *)plVar33 = (char)uVar40;
                    plVar31 = (long *)((long)plVar33 + 1);
                  }
                  plVar33 = (long *)(uVar4 + (long)plVar31);
                  plVar18 = plVar8;
                  do {
                    *plVar31 = *plVar18;
                    plVar31 = plVar31 + 1;
                    plVar18 = plVar18 + 1;
                  } while (plVar31 < plVar33);
                  iVar23 = 0;
                }
                plVar31 = plVar9;
                piVar17 = piVar37;
                if (pcVar22 <= pcVar30) {
                  do {
                    uVar4 = 0xcf1bbcdcbb000000;
                    *(short *)plVar33 = (short)plVar9 - (short)piVar37;
                    puVar32 = (ulong *)((long)plVar9 + 4);
                    puVar5 = (ulong *)(piVar37 + 1);
                    puVar14 = puVar32;
                    if (puVar32 < source + ((ulong)(uint)inputSize - 0xc)) {
                      uVar40 = *(ulong *)((long)plVar9 + 4) ^ *(ulong *)(piVar37 + 1);
                      uVar4 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      uVar4 = uVar4 >> 3 & 0x1fffffff;
                      uVar13 = (uint)uVar4;
                      puVar14 = (ulong *)((long)plVar9 + 0xc);
                      puVar5 = (ulong *)(piVar37 + 3);
                      if (*(ulong *)(piVar37 + 1) == *(ulong *)((long)plVar9 + 4))
                      goto LAB_001126a5;
                    }
                    else {
LAB_001126a5:
                      do {
                        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar14) {
                          if ((puVar14 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar5 == (int)*puVar14)) {
                            puVar14 = (ulong *)((long)puVar14 + 4);
                            puVar5 = (ulong *)((long)puVar5 + 4);
                          }
                          if ((puVar14 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar5 == (short)*puVar14)) {
                            puVar14 = (ulong *)((long)puVar14 + 2);
                            puVar5 = (ulong *)((long)puVar5 + 2);
                          }
                          if (puVar14 < source + ((ulong)(uint)inputSize - 5)) {
                            puVar14 = (ulong *)((long)puVar14 +
                                               (ulong)((char)*puVar5 == (char)*puVar14));
                          }
                          uVar13 = (int)puVar14 - (int)puVar32;
                          break;
                        }
                        uVar40 = *puVar5;
                        uVar36 = *puVar14 ^ uVar40;
                        uVar35 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                          }
                        }
                        puVar26 = (ulong *)((uVar35 >> 3 & 0x1fffffff) + (long)puVar14);
                        puVar5 = puVar5 + 1;
                        bVar49 = uVar40 == *puVar14;
                        puVar14 = puVar14 + 1;
                        if (!bVar49) {
                          puVar14 = puVar26;
                        }
                        uVar4 = uVar4 & 0xffffffff;
                        if (!bVar49) {
                          uVar4 = (ulong)(uint)((int)puVar26 - (int)puVar32);
                        }
                        uVar13 = (uint)uVar4;
                      } while (bVar49);
                    }
                    plVar18 = (long *)((long)plVar33 + 2);
                    pcVar22 = (char *)((long)plVar33 + (ulong)(uVar13 + 0xf0) / 0xff + 8);
                    if (pcVar22 <= pcVar30) {
                      if (uVar13 < 0xf) {
                        *(char *)local_b0 = (char)*local_b0 + (char)uVar13;
                      }
                      else {
                        *(char *)local_b0 = (char)*local_b0 + '\x0f';
                        uVar28 = uVar13 - 0xf;
                        *(undefined4 *)plVar18 = 0xffffffff;
                        if (0x3fb < uVar28) {
                          uVar27 = uVar13 - 0x40b;
                          memset((char *)((long)plVar33 + 6),0xff,(ulong)((uVar27 / 0x3fc) * 4 + 4))
                          ;
                          uVar28 = uVar27 % 0x3fc;
                          plVar18 = (long *)((long)plVar33 + (ulong)((uVar27 / 0x3fc) * 4) + 6);
                        }
                        pcVar44 = (char *)((long)plVar18 + (ulong)uVar28 / 0xff);
                        plVar18 = (long *)(pcVar44 + 1);
                        *pcVar44 = (char)(uVar28 / 0xff) + (char)uVar28;
                      }
                    }
                    lVar29 = (ulong)uVar13 + (long)plVar9;
                    plVar9 = (long *)(lVar29 + 4);
                    plVar31 = plVar9;
                    piVar17 = piVar37;
                    plVar33 = plVar18;
                    if (pcVar30 < pcVar22) {
                      iVar23 = 1;
                      goto LAB_00112919;
                    }
                    plVar8 = plVar9;
                    if (source + ((ulong)(uint)inputSize - 0xb) <= plVar9) {
                      iVar23 = 3;
                      goto LAB_00112919;
                    }
                    *(int *)((long)LZ4_stream +
                            ((ulong)(*(long *)(lVar29 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                         ((int)lVar29 + 2) - iVar25;
                    uVar4 = (ulong)(*plVar9 * -0x30e4432345000000) >> 0x34;
                    uVar28 = (int)plVar9 - iVar25;
                    uVar13 = *(uint *)((long)LZ4_stream + uVar4 * 4);
                    piVar37 = (int *)((ulong)uVar13 + lVar46);
                    *(uint *)((long)LZ4_stream + uVar4 * 4) = uVar28;
                    bVar49 = true;
                    if (((uVar10 - uVar20 <= uVar13) && (uVar28 <= uVar13 + 0xffff)) &&
                       (*piVar37 == *(int *)plVar9)) {
                      *(char *)plVar18 = '\0';
                      bVar49 = false;
                      plVar33 = (long *)((long)plVar18 + 1);
                      local_b0 = plVar18;
                    }
                  } while (!bVar49);
                  uVar43 = (ulong)(*(long *)(lVar29 + 5) * -0x30e4432345000000) >> 0x34;
                  iVar23 = 0;
                  plVar31 = (long *)(lVar29 + 5);
                  piVar17 = piVar37;
                }
              }
LAB_00112919:
              local_b0 = plVar33;
            } while (iVar23 == 0);
            dest = (char *)local_b0;
            if (1 < iVar23 - 2U) {
              return 0;
            }
          }
          pcVar44 = source + ((ulong)(uint)inputSize - (long)plVar8);
          pcVar22 = (char *)((long)dest + (long)(pcVar44 + (ulong)(pcVar44 + 0xf0) / 0xff + 1));
          if (pcVar22 <= pcVar30) {
            if (pcVar44 < (char *)0xf) {
              *dest = (char)pcVar44 << 4;
            }
            else {
              pcVar7 = pcVar44 + -0xf;
              *dest = -0x10;
              plVar31 = (long *)((long)dest + 1);
              if ((char *)0xfe < pcVar7) {
                uVar42 = (ulong)(pcVar44 + -0x10e) / 0xff;
                memset((long *)((long)dest + 1),0xff,uVar42 + 1);
                pcVar7 = pcVar44 + uVar42 * -0xff + -0x10e;
                plVar31 = (long *)((long)dest + uVar42 + 2);
              }
              dest = (char *)plVar31;
              *dest = (char)pcVar7;
            }
            memcpy((char *)((long)dest + 1),plVar8,(size_t)pcVar44);
            dest = (char *)((long)dest + (long)(pcVar44 + 1));
          }
          if (pcVar22 <= pcVar30) {
            return (int)dest - iVar47;
          }
          return 0;
        }
        goto LAB_00111a95;
      }
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize != 0) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      pcVar30 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      local_d0 = (long *)dest;
      plVar8 = (long *)source;
      if (0xc < inputSize) {
        lVar46 = (long)source - (ulong)uVar10;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar10;
        plVar31 = (long *)(source + 1);
        uVar43 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        do {
          uVar10 = 1;
          uVar20 = iVar21 << 6;
          while( true ) {
            plVar33 = (long *)((ulong)uVar10 + (long)plVar31);
            iVar19 = (int)plVar31;
            iVar25 = (int)lVar46;
            if (source + ((ulong)(uint)inputSize - 0xb) < plVar33) {
              iVar23 = 2;
            }
            else {
              uVar10 = *(uint *)((long)LZ4_stream + uVar43 * 4);
              local_90 = (int *)((ulong)uVar10 + lVar46);
              uVar4 = (ulong)(*plVar33 * -0x30e4432345000000) >> 0x34;
              *(int *)((long)LZ4_stream + uVar43 * 4) = iVar19 - iVar25;
              iVar23 = 8;
              uVar43 = uVar4;
              if (((uint)(iVar19 - iVar25) <= uVar10 + 0xffff) &&
                 (iVar23 = 7, *local_90 != (int)*plVar31)) {
                iVar23 = 0;
              }
            }
            if ((iVar23 != 0) && (iVar23 != 8)) break;
            uVar10 = uVar20 >> 6;
            uVar20 = uVar20 + 1;
            plVar31 = plVar33;
          }
          if (iVar23 == 7) {
            iVar23 = 0;
          }
          plVar33 = local_d0;
          if (iVar23 == 0) {
            uVar10 = iVar19 - (int)plVar8;
            lVar29 = 0;
            cVar2 = (char)plVar31 * '\x10' + (char)plVar8 * -0x10;
            uVar20 = uVar10 - 0xf;
            do {
              uVar13 = uVar20;
              cVar34 = cVar2;
              lVar39 = lVar29;
              piVar17 = (int *)((long)local_90 + lVar39);
              plVar9 = (long *)((long)plVar31 + lVar39);
              if ((piVar17 <= source + -uVar42) || (plVar9 <= plVar8)) break;
              lVar29 = lVar39 + -1;
              cVar2 = cVar34 + -0x10;
              uVar20 = uVar13 - 1;
            } while (*(char *)((long)plVar31 + lVar39 + -1) ==
                     *(char *)((long)local_90 + lVar39 + -1));
            iVar23 = (int)lVar39;
            plVar18 = (long *)(ulong)(uint)(iVar23 + (iVar19 - (int)plVar8));
            plVar33 = (long *)((long)local_d0 + 1);
            pcVar22 = (char *)((long)local_d0 + (long)plVar18);
            if (pcVar30 < pcVar22 + ((ulong)uVar10 + lVar39 & 0xffffffff) / 0xff + 9) {
              iVar23 = 1;
            }
            else {
              if ((uint)((ulong)uVar10 + lVar39) < 0xf) {
                *(char *)local_d0 = cVar34;
                plVar31 = plVar33;
              }
              else {
                uVar4 = (ulong)(uVar10 - 0xf) + lVar39;
                *(char *)local_d0 = -0x10;
                if (0xfe < (int)uVar4) {
                  if (0x1fc < (int)uVar13) {
                    uVar13 = 0x1fd;
                  }
                  uVar20 = (uVar10 - uVar13) + iVar23 + 0xef;
                  uVar4 = (ulong)uVar20 / 0xff;
                  memset(plVar33,0xff,(ulong)(uVar20 / 0xff + 1));
                  plVar33 = (long *)((long)local_d0 + uVar4 + 2);
                  uVar4 = (ulong)((uVar10 - 0x10e) + iVar23 + (int)uVar4 * -0xff);
                }
                *(char *)plVar33 = (char)uVar4;
                plVar31 = (long *)((long)plVar33 + 1);
              }
              plVar33 = (long *)((long)plVar18 + (long)plVar31);
              plVar18 = plVar8;
              do {
                *plVar31 = *plVar18;
                plVar31 = plVar31 + 1;
                plVar18 = plVar18 + 1;
              } while (plVar31 < plVar33);
              iVar23 = 0;
              plVar18 = plVar33;
            }
            plVar31 = plVar9;
            local_90 = piVar17;
            if (pcVar22 + ((ulong)uVar10 + lVar39 & 0xffffffff) / 0xff + 9 <= pcVar30) {
              do {
                *(short *)plVar33 = (short)plVar9 - (short)piVar17;
                puVar32 = (ulong *)((long)plVar9 + 4);
                puVar5 = (ulong *)(piVar17 + 1);
                puVar14 = puVar32;
                if (puVar32 < source + ((ulong)(uint)inputSize - 0xc)) {
                  uVar40 = *(ulong *)((long)plVar9 + 4) ^ *(ulong *)(piVar17 + 1);
                  uVar4 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  plVar18 = (long *)(uVar4 >> 3 & 0x1fffffff);
                  uVar20 = (uint)plVar18;
                  puVar14 = (ulong *)((long)plVar9 + 0xc);
                  puVar5 = (ulong *)(piVar17 + 3);
                  if (*(ulong *)(piVar17 + 1) == *(ulong *)((long)plVar9 + 4)) goto LAB_00111daa;
                }
                else {
LAB_00111daa:
                  do {
                    if (source + ((ulong)(uint)inputSize - 0xc) <= puVar14) {
                      if ((puVar14 < source + ((ulong)(uint)inputSize - 8)) &&
                         ((int)*puVar5 == (int)*puVar14)) {
                        puVar14 = (ulong *)((long)puVar14 + 4);
                        puVar5 = (ulong *)((long)puVar5 + 4);
                      }
                      if ((puVar14 < source + ((ulong)(uint)inputSize - 6)) &&
                         ((short)*puVar5 == (short)*puVar14)) {
                        puVar14 = (ulong *)((long)puVar14 + 2);
                        puVar5 = (ulong *)((long)puVar5 + 2);
                      }
                      if (puVar14 < source + ((ulong)(uint)inputSize - 5)) {
                        puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar5 == (char)*puVar14)
                                           );
                      }
                      uVar20 = (int)puVar14 - (int)puVar32;
                      break;
                    }
                    uVar4 = *puVar5;
                    uVar35 = *puVar14 ^ uVar4;
                    uVar40 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    puVar26 = (ulong *)((uVar40 >> 3 & 0x1fffffff) + (long)puVar14);
                    puVar5 = puVar5 + 1;
                    bVar49 = uVar4 == *puVar14;
                    puVar14 = puVar14 + 1;
                    if (!bVar49) {
                      puVar14 = puVar26;
                    }
                    plVar18 = (long *)((ulong)plVar18 & 0xffffffff);
                    if (!bVar49) {
                      plVar18 = (long *)(ulong)(uint)((int)puVar26 - (int)puVar32);
                    }
                    uVar20 = (uint)plVar18;
                  } while (bVar49);
                }
                plVar18 = (long *)((long)plVar33 + 2);
                pcVar22 = (char *)((long)plVar33 + (ulong)(uVar20 + 0xf0) / 0xff + 8);
                if (pcVar22 <= pcVar30) {
                  if (uVar20 < 0xf) {
                    *(char *)local_d0 = (char)*local_d0 + (char)uVar20;
                  }
                  else {
                    *(char *)local_d0 = (char)*local_d0 + '\x0f';
                    uVar10 = uVar20 - 0xf;
                    *(undefined4 *)plVar18 = 0xffffffff;
                    if (0x3fb < uVar10) {
                      uVar13 = uVar20 - 0x40b;
                      memset((char *)((long)plVar33 + 6),0xff,(ulong)((uVar13 / 0x3fc) * 4 + 4));
                      uVar10 = uVar13 % 0x3fc;
                      plVar18 = (long *)((long)plVar33 + (ulong)((uVar13 / 0x3fc) * 4) + 6);
                    }
                    pcVar44 = (char *)((long)plVar18 + (ulong)uVar10 / 0xff);
                    plVar18 = (long *)(pcVar44 + 1);
                    *pcVar44 = (char)(uVar10 / 0xff) + (char)uVar10;
                  }
                }
                lVar29 = (ulong)uVar20 + (long)plVar9;
                plVar9 = (long *)(lVar29 + 4);
                plVar31 = plVar9;
                plVar33 = plVar18;
                local_90 = piVar17;
                if (pcVar30 < pcVar22) {
                  iVar23 = 1;
                  goto LAB_00112013;
                }
                plVar8 = plVar9;
                if (source + ((ulong)(uint)inputSize - 0xb) <= plVar9) {
                  iVar23 = 3;
                  goto LAB_00112013;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)(lVar29 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                     ((int)lVar29 + 2) - iVar25;
                uVar4 = (ulong)(*plVar9 * -0x30e4432345000000) >> 0x34;
                uVar10 = (int)plVar9 - iVar25;
                uVar20 = *(uint *)((long)LZ4_stream + uVar4 * 4);
                piVar17 = (int *)((ulong)uVar20 + lVar46);
                *(uint *)((long)LZ4_stream + uVar4 * 4) = uVar10;
                bVar49 = true;
                if ((uVar10 <= uVar20 + 0xffff) && (*piVar17 == *(int *)plVar9)) {
                  *(char *)plVar18 = '\0';
                  bVar49 = false;
                  local_d0 = plVar18;
                  plVar18 = (long *)((long)plVar18 + 1);
                }
                plVar33 = plVar18;
                plVar18 = (long *)dest;
              } while (!bVar49);
              uVar43 = (ulong)(*(long *)(lVar29 + 5) * -0x30e4432345000000) >> 0x34;
              iVar23 = 0;
              plVar31 = (long *)(lVar29 + 5);
              local_90 = piVar17;
            }
          }
LAB_00112013:
          local_d0 = plVar33;
        } while (iVar23 == 0);
        if (1 < iVar23 - 2U) {
          return 0;
        }
      }
      pcVar44 = source + ((ulong)(uint)inputSize - (long)plVar8);
      pcVar22 = (char *)((long)local_d0 + (long)(pcVar44 + (ulong)(pcVar44 + 0xf0) / 0xff + 1));
      if (pcVar22 <= pcVar30) {
        if (pcVar44 < (char *)0xf) {
          *(char *)local_d0 = (char)pcVar44 << 4;
        }
        else {
          pcVar7 = pcVar44 + -0xf;
          *(char *)local_d0 = -0x10;
          plVar31 = (long *)((long)local_d0 + 1);
          if ((char *)0xfe < pcVar7) {
            uVar42 = (ulong)(pcVar44 + -0x10e) / 0xff;
            memset(plVar31,0xff,uVar42 + 1);
            plVar31 = (long *)((long)local_d0 + uVar42 + 2);
            pcVar7 = pcVar44 + uVar42 * -0xff + -0x10e;
          }
          *(char *)plVar31 = (char)pcVar7;
          local_d0 = plVar31;
        }
        memcpy((char *)((long)local_d0 + 1),plVar8,(size_t)pcVar44);
        local_d0 = (long *)((long)local_d0 + (long)(pcVar44 + 1));
      }
      if (pcVar22 <= pcVar30) {
        return (int)local_d0 - iVar47;
      }
      return 0;
    }
LAB_00111a95:
    if (0 < maxOutputSize) {
      *dest = '\0';
    }
    return (uint)(0 < maxOutputSize);
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  local_e8 = (ulong *)source;
  local_c0 = (ulong *)source;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    uVar20 = (LZ4_stream->internal_donotuse).dictSize;
    uVar42 = (ulong)uVar20;
    if (uVar42 < 0x10000) {
      uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar20 < uVar10) {
        if ((uint)inputSize < 0x7e000001) {
          if (inputSize != 0) {
            piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
            lVar29 = uVar42 + (long)piVar17;
            lVar46 = lVar29 - (ulong)uVar10;
            if (piVar17 == (int *)0x0) {
              lVar46 = 0;
            }
            pcVar30 = dest + maxOutputSize;
            (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
            (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
            (LZ4_stream->internal_donotuse).tableType = 2;
            if (0xc < inputSize) {
              lVar39 = (long)source - (ulong)uVar10;
              puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
              if (piVar17 == (int *)0x0) {
                lVar29 = 0;
              }
              *(uint *)((long)LZ4_stream +
                       ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar10;
              puVar14 = (ulong *)(source + 1);
              uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
              puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
              iVar19 = 0;
              piVar37 = (int *)source;
              local_e8 = (ulong *)dest;
              do {
                uVar28 = 1;
                uVar13 = iVar21 << 6;
                while( true ) {
                  puVar26 = (ulong *)((ulong)uVar28 + (long)puVar14);
                  iVar25 = (int)puVar14;
                  iVar23 = (int)lVar39;
                  if (source + ((ulong)(uint)inputSize - 0xb) < puVar26) {
                    iVar12 = 2;
                  }
                  else {
                    uVar27 = iVar25 - iVar23;
                    uVar28 = *(uint *)((long)LZ4_stream + uVar42 * 4);
                    lVar1 = lVar39;
                    if (uVar28 < uVar10) {
                      lVar1 = lVar46;
                    }
                    local_b8 = (int *)(lVar1 + (ulong)uVar28);
                    piVar37 = (int *)source;
                    if (uVar28 < uVar10) {
                      piVar37 = piVar17;
                    }
                    uVar43 = *puVar26 * -0x30e4432345000000 >> 0x34;
                    *(uint *)((long)LZ4_stream + uVar42 * 4) = uVar27;
                    iVar12 = 8;
                    uVar42 = uVar43;
                    if ((uVar10 - uVar20 <= uVar28) && (uVar27 <= uVar28 + 0xffff)) {
                      if (*local_b8 == (int)*puVar14) {
                        iVar19 = uVar27 - uVar28;
                        iVar12 = 7;
                      }
                      else {
                        iVar12 = 0;
                      }
                    }
                  }
                  if ((iVar12 != 0) && (iVar12 != 8)) break;
                  uVar28 = uVar13 >> 6;
                  uVar13 = uVar13 + 1;
                  puVar14 = puVar26;
                }
                if (iVar12 == 7) {
                  iVar12 = 0;
                }
                puVar26 = local_e8;
                if (iVar12 == 0) {
                  uVar28 = iVar25 - (int)local_c0;
                  lVar1 = 0;
                  cVar2 = (char)puVar14 * '\x10' + (char)local_c0 * -0x10;
                  uVar13 = uVar28 - 0xf;
                  do {
                    uVar27 = uVar13;
                    cVar34 = cVar2;
                    lVar38 = lVar1;
                    piVar48 = (int *)((long)local_b8 + lVar38);
                    puVar24 = (ulong *)((long)puVar14 + lVar38);
                    if ((piVar48 <= piVar37) || (puVar24 <= local_c0)) break;
                    lVar1 = lVar38 + -1;
                    cVar2 = cVar34 + -0x10;
                    uVar13 = uVar27 - 1;
                  } while (*(char *)((long)puVar14 + lVar38 + -1) ==
                           *(char *)((long)local_b8 + lVar38 + -1));
                  iVar12 = (int)lVar38;
                  uVar43 = (ulong)(uint)((iVar25 - (int)local_c0) + iVar12);
                  puVar26 = (ulong *)((long)local_e8 + 1);
                  pcVar22 = (char *)((long)local_e8 +
                                    ((ulong)uVar28 + lVar38 & 0xffffffff) / 0xff + uVar43 + 9);
                  if (pcVar30 < pcVar22) {
                    iVar12 = 1;
                  }
                  else {
                    if ((uint)((ulong)uVar28 + lVar38) < 0xf) {
                      *(char *)local_e8 = cVar34;
                      puVar14 = puVar26;
                    }
                    else {
                      uVar4 = (ulong)(uVar28 - 0xf) + lVar38;
                      *(char *)local_e8 = -0x10;
                      if (0xfe < (int)uVar4) {
                        if (0x1fc < (int)uVar27) {
                          uVar27 = 0x1fd;
                        }
                        uVar13 = (uVar28 - uVar27) + iVar12 + 0xef;
                        uVar4 = (ulong)uVar13 / 0xff;
                        memset(puVar26,0xff,(ulong)(uVar13 / 0xff + 1));
                        puVar26 = (ulong *)((long)local_e8 + uVar4 + 2);
                        uVar4 = (ulong)((uVar28 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
                      }
                      *(char *)puVar26 = (char)uVar4;
                      puVar14 = (ulong *)((long)puVar26 + 1);
                    }
                    puVar26 = (ulong *)(uVar43 + (long)puVar14);
                    puVar6 = local_c0;
                    do {
                      *puVar14 = *puVar6;
                      puVar14 = puVar14 + 1;
                      puVar6 = puVar6 + 1;
                    } while (puVar14 < puVar26);
                    iVar12 = 0;
                  }
                  puVar14 = puVar24;
                  local_b8 = piVar48;
                  if (pcVar22 <= pcVar30) {
                    do {
                      *(short *)puVar26 = (short)iVar19;
                      if (piVar37 == piVar17) {
                        puVar14 = (ulong *)((lVar29 - (long)piVar48) + (long)puVar24);
                        if (puVar32 < puVar14) {
                          puVar14 = puVar32;
                        }
                        puVar6 = (ulong *)((long)puVar24 + 4);
                        puVar15 = (ulong *)(piVar48 + 1);
                        puVar16 = puVar6;
                        puVar41 = puVar15;
                        if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                          uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(piVar48 + 1);
                          uVar43 = 0;
                          if (uVar4 != 0) {
                            for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                            }
                          }
                          uVar43 = uVar43 >> 3 & 0x1fffffff;
                          puVar16 = (ulong *)((long)puVar24 + 0xc);
                          puVar41 = (ulong *)(piVar48 + 3);
                          if (*(ulong *)(piVar48 + 1) == *(ulong *)((long)puVar24 + 4))
                          goto LAB_0010fbe7;
                        }
                        else {
LAB_0010fbe7:
                          do {
                            puVar15 = puVar41;
                            if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                              if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                                 ((int)*puVar15 == (int)*puVar16)) {
                                puVar16 = (ulong *)((long)puVar16 + 4);
                                puVar15 = (ulong *)((long)puVar15 + 4);
                              }
                              if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                                 ((short)*puVar15 == (short)*puVar16)) {
                                puVar16 = (ulong *)((long)puVar16 + 2);
                                puVar15 = (ulong *)((long)puVar15 + 2);
                              }
                              if (puVar16 < puVar14) {
                                uVar43 = *puVar15;
                                puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar43
                                                           );
                                puVar16 = (ulong *)((long)puVar16 +
                                                   (ulong)((char)uVar43 == (char)*puVar16));
                              }
                              uVar43 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                              goto LAB_0010fc22;
                            }
                            uVar43 = *puVar15;
                            uVar4 = *puVar16;
                            uVar35 = uVar4 ^ uVar43;
                            uVar40 = 0;
                            if (uVar35 != 0) {
                              for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                              }
                            }
                            iVar25 = (int)puVar16;
                            puVar15 = puVar15 + 1;
                            puVar16 = puVar16 + 1;
                            puVar41 = puVar15;
                          } while (uVar43 == uVar4);
                          uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar25) -
                                          (int)puVar6);
                        }
LAB_0010fc22:
                        uVar13 = (uint)uVar43;
                        puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                        if (puVar24 == puVar14) {
                          puVar16 = puVar14;
                          puVar6 = (ulong *)source;
                          if (puVar14 < puVar5) {
                            uVar43 = *(ulong *)source;
                            uVar4 = *puVar14;
                            uVar40 = 0;
                            if ((uVar4 ^ uVar43) != 0) {
                              for (; ((uVar4 ^ uVar43) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                              }
                            }
                            puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                            uVar28 = (uint)puVar15;
                            if (uVar43 == uVar4) {
                              puVar6 = (ulong *)(source + (ulong)(uVar43 == uVar4) * 8);
                              puVar16 = puVar14 + (uVar43 == uVar4);
                              goto LAB_0010fe2b;
                            }
                          }
                          else {
LAB_0010fe2b:
                            do {
                              if (puVar5 <= puVar16) {
                                if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                                   ((int)*puVar6 == (int)*puVar16)) {
                                  puVar16 = (ulong *)((long)puVar16 + 4);
                                  puVar6 = (ulong *)((long)puVar6 + 4);
                                }
                                if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                                   ((short)*puVar6 == (short)*puVar16)) {
                                  puVar16 = (ulong *)((long)puVar16 + 2);
                                  puVar6 = (ulong *)((long)puVar6 + 2);
                                }
                                if (puVar16 < puVar32) {
                                  puVar16 = (ulong *)((long)puVar16 +
                                                     (ulong)((char)*puVar6 == (char)*puVar16));
                                }
                                uVar28 = (int)puVar16 - (int)puVar14;
                                break;
                              }
                              uVar43 = *puVar6;
                              uVar40 = *puVar16 ^ uVar43;
                              uVar4 = 0;
                              if (uVar40 != 0) {
                                for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                                }
                              }
                              puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                              puVar6 = puVar6 + 1;
                              bVar49 = uVar43 == *puVar16;
                              puVar16 = puVar16 + 1;
                              if (!bVar49) {
                                puVar16 = puVar41;
                              }
                              puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                              if (!bVar49) {
                                puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                              }
                              uVar28 = (uint)puVar15;
                            } while (bVar49);
                          }
                          uVar13 = uVar13 + uVar28;
                          puVar24 = (ulong *)((long)puVar24 + (ulong)uVar28);
                        }
                      }
                      else {
                        puVar14 = (ulong *)((long)puVar24 + 4);
                        puVar6 = (ulong *)(piVar48 + 1);
                        puVar15 = puVar14;
                        if (puVar14 < puVar5) {
                          uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(piVar48 + 1);
                          uVar43 = 0;
                          if (uVar4 != 0) {
                            for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                            }
                          }
                          uVar43 = uVar43 >> 3 & 0x1fffffff;
                          puVar15 = (ulong *)((long)puVar24 + 0xc);
                          puVar6 = (ulong *)(piVar48 + 3);
                          if (*(ulong *)(piVar48 + 1) == *(ulong *)((long)puVar24 + 4))
                          goto LAB_0010fb3c;
                        }
                        else {
LAB_0010fb3c:
                          do {
                            if (puVar5 <= puVar15) {
                              if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                                 ((int)*puVar6 == (int)*puVar15)) {
                                puVar15 = (ulong *)((long)puVar15 + 4);
                                puVar6 = (ulong *)((long)puVar6 + 4);
                              }
                              if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                                 ((short)*puVar6 == (short)*puVar15)) {
                                puVar15 = (ulong *)((long)puVar15 + 2);
                                puVar6 = (ulong *)((long)puVar6 + 2);
                              }
                              if (puVar15 < puVar32) {
                                puVar15 = (ulong *)((long)puVar15 +
                                                   (ulong)((char)*puVar6 == (char)*puVar15));
                              }
                              uVar43 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                              goto LAB_0010fb77;
                            }
                            uVar43 = *puVar6;
                            uVar4 = *puVar15;
                            uVar35 = uVar4 ^ uVar43;
                            uVar40 = 0;
                            if (uVar35 != 0) {
                              for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                              }
                            }
                            iVar25 = (int)puVar15;
                            puVar6 = puVar6 + 1;
                            puVar15 = puVar15 + 1;
                          } while (uVar43 == uVar4);
                          uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar25) -
                                          (int)puVar14);
                        }
LAB_0010fb77:
                        uVar13 = (uint)uVar43;
                        puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                      }
                      puVar6 = (ulong *)((long)puVar26 + 2);
                      pcVar22 = (char *)((long)puVar26 + (ulong)(uVar13 + 0xf0) / 0xff + 8);
                      if (pcVar22 <= pcVar30) {
                        if (uVar13 < 0xf) {
                          *(char *)local_e8 = (char)*local_e8 + (char)uVar13;
                        }
                        else {
                          *(char *)local_e8 = (char)*local_e8 + '\x0f';
                          uVar28 = uVar13 - 0xf;
                          *(undefined4 *)puVar6 = 0xffffffff;
                          if (0x3fb < uVar28) {
                            uVar13 = uVar13 - 0x40b;
                            memset((char *)((long)puVar26 + 6),0xff,
                                   (ulong)((uVar13 / 0x3fc) * 4 + 4));
                            uVar28 = uVar13 % 0x3fc;
                            puVar6 = (ulong *)((long)puVar26 + (ulong)((uVar13 / 0x3fc) * 4) + 6);
                          }
                          pcVar44 = (char *)((long)puVar6 + (ulong)uVar28 / 0xff);
                          puVar6 = (ulong *)(pcVar44 + 1);
                          *pcVar44 = (char)((ulong)uVar28 * 0x8080808081 >> 0x27);
                        }
                      }
                      puVar14 = puVar24;
                      puVar26 = puVar6;
                      local_b8 = piVar48;
                      if (pcVar30 < pcVar22) {
                        iVar12 = 1;
                        goto LAB_0010ffe3;
                      }
                      local_c0 = puVar24;
                      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                        iVar12 = 3;
                        goto LAB_0010ffe3;
                      }
                      *(int *)((long)LZ4_stream +
                              ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34)
                              * 4) = ((int)puVar24 + -2) - iVar23;
                      uVar43 = *puVar24 * -0x30e4432345000000 >> 0x34;
                      uVar28 = (int)puVar24 - iVar23;
                      uVar13 = *(uint *)((long)LZ4_stream + uVar43 * 4);
                      lVar1 = lVar39;
                      if (uVar13 < uVar10) {
                        lVar1 = lVar46;
                      }
                      piVar48 = (int *)((ulong)uVar13 + lVar1);
                      piVar37 = (int *)source;
                      if (uVar13 < uVar10) {
                        piVar37 = piVar17;
                      }
                      *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar28;
                      bVar49 = true;
                      if (((uVar10 - uVar20 <= uVar13) && (uVar28 <= uVar13 + 0xffff)) &&
                         (*piVar48 == (int)*puVar24)) {
                        *(char *)puVar6 = '\0';
                        iVar19 = uVar28 - uVar13;
                        bVar49 = false;
                        puVar26 = (ulong *)((long)puVar6 + 1);
                        local_e8 = puVar6;
                      }
                    } while (!bVar49);
                    uVar42 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
                    iVar12 = 0;
                    puVar14 = (ulong *)((long)puVar24 + 1);
                    local_b8 = piVar48;
                  }
                }
LAB_0010ffe3:
                local_e8 = puVar26;
              } while (iVar12 == 0);
              dest = (char *)local_e8;
              if (1 < iVar12 - 2U) goto LAB_001122e4;
            }
            pcVar44 = source + ((ulong)(uint)inputSize - (long)local_c0);
            pcVar22 = (char *)((long)dest + (long)(pcVar44 + (ulong)(pcVar44 + 0xf0) / 0xff + 1));
            if (pcVar22 <= pcVar30) {
              if (pcVar44 < (char *)0xf) {
                *dest = (char)pcVar44 << 4;
              }
              else {
                pcVar7 = pcVar44 + -0xf;
                *dest = -0x10;
                puVar32 = (ulong *)((long)dest + 1);
                if ((char *)0xfe < pcVar7) {
                  uVar42 = (ulong)(pcVar44 + -0x10e) / 0xff;
                  memset((ulong *)((long)dest + 1),0xff,uVar42 + 1);
                  pcVar7 = pcVar44 + uVar42 * -0xff + -0x10e;
                  puVar32 = (ulong *)((long)dest + uVar42 + 2);
                }
                dest = (char *)puVar32;
                *dest = (char)pcVar7;
              }
              memcpy((char *)((long)dest + 1),local_c0,(size_t)pcVar44);
              dest = (char *)((long)dest + (long)(pcVar44 + 1));
            }
            iVar21 = 0;
            if (pcVar22 <= pcVar30) {
              iVar21 = (int)dest - iVar47;
            }
            goto LAB_00110910;
          }
          goto LAB_00111a79;
        }
        goto LAB_0011090b;
      }
    }
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar10 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        lVar29 = uVar42 + (long)piVar17;
        lVar46 = lVar29 - (ulong)uVar10;
        if (piVar17 == (int *)0x0) {
          lVar46 = 0;
        }
        pcVar30 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar20 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar10 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < inputSize) {
          lVar39 = (long)source - (ulong)uVar10;
          puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar17 == (int *)0x0) {
            lVar29 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar10;
          puVar14 = (ulong *)(source + 1);
          uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
          iVar19 = 0;
          piVar37 = (int *)source;
          local_c8 = (ulong *)dest;
          do {
            uVar13 = 1;
            uVar20 = iVar21 << 6;
            while( true ) {
              puVar26 = (ulong *)((ulong)uVar13 + (long)puVar14);
              iVar23 = (int)puVar14;
              iVar25 = (int)lVar39;
              if (source + ((ulong)(uint)inputSize - 0xb) < puVar26) {
                iVar12 = 2;
              }
              else {
                uVar28 = iVar23 - iVar25;
                uVar13 = *(uint *)((long)LZ4_stream + uVar42 * 4);
                lVar1 = lVar39;
                if (uVar13 < uVar10) {
                  lVar1 = lVar46;
                }
                local_d0 = (long *)(lVar1 + (ulong)uVar13);
                piVar37 = (int *)source;
                if (uVar13 < uVar10) {
                  piVar37 = piVar17;
                }
                uVar43 = *puVar26 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_stream + uVar42 * 4) = uVar28;
                iVar12 = 8;
                uVar42 = uVar43;
                if (uVar28 <= uVar13 + 0xffff) {
                  if (*(int *)local_d0 == (int)*puVar14) {
                    iVar19 = uVar28 - uVar13;
                    iVar12 = 7;
                  }
                  else {
                    iVar12 = 0;
                  }
                }
              }
              if ((iVar12 != 0) && (iVar12 != 8)) break;
              uVar13 = uVar20 >> 6;
              uVar20 = uVar20 + 1;
              puVar14 = puVar26;
            }
            if (iVar12 == 7) {
              iVar12 = 0;
            }
            puVar26 = local_c8;
            if (iVar12 == 0) {
              uVar13 = iVar23 - (int)local_e8;
              lVar1 = 0;
              cVar2 = (char)puVar14 * '\x10' + (char)local_e8 * -0x10;
              uVar20 = uVar13 - 0xf;
              do {
                uVar28 = uVar20;
                cVar34 = cVar2;
                lVar38 = lVar1;
                piVar48 = (int *)((long)local_d0 + lVar38);
                puVar24 = (ulong *)(lVar38 + (long)puVar14);
                if ((piVar48 <= piVar37) || (puVar24 <= local_e8)) break;
                lVar1 = lVar38 + -1;
                cVar2 = cVar34 + -0x10;
                uVar20 = uVar28 - 1;
              } while (*(char *)((long)puVar14 + lVar38 + -1) ==
                       *(char *)((long)local_d0 + lVar38 + -1));
              iVar12 = (int)lVar38;
              uVar43 = (ulong)(uint)((iVar23 - (int)local_e8) + iVar12);
              puVar26 = (ulong *)((long)local_c8 + 1);
              pcVar22 = (char *)((long)local_c8 +
                                ((ulong)uVar13 + lVar38 & 0xffffffff) / 0xff + uVar43 + 9);
              if (pcVar30 < pcVar22) {
                iVar12 = 1;
              }
              else {
                if ((uint)((ulong)uVar13 + lVar38) < 0xf) {
                  *(char *)local_c8 = cVar34;
                  puVar14 = puVar26;
                }
                else {
                  uVar4 = (ulong)(uVar13 - 0xf) + lVar38;
                  *(char *)local_c8 = -0x10;
                  if (0xfe < (int)uVar4) {
                    if (0x1fc < (int)uVar28) {
                      uVar28 = 0x1fd;
                    }
                    uVar20 = (uVar13 - uVar28) + iVar12 + 0xef;
                    uVar4 = (ulong)uVar20 / 0xff;
                    memset(puVar26,0xff,(ulong)(uVar20 / 0xff + 1));
                    puVar26 = (ulong *)((long)local_c8 + uVar4 + 2);
                    uVar4 = (ulong)((uVar13 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
                  }
                  *(char *)puVar26 = (char)uVar4;
                  puVar14 = (ulong *)((long)puVar26 + 1);
                }
                puVar26 = (ulong *)(uVar43 + (long)puVar14);
                puVar6 = local_e8;
                do {
                  *puVar14 = *puVar6;
                  puVar14 = puVar14 + 1;
                  puVar6 = puVar6 + 1;
                } while (puVar14 < puVar26);
                iVar12 = 0;
              }
              puVar14 = puVar24;
              local_d0 = (long *)piVar48;
              if (pcVar22 <= pcVar30) {
                do {
                  *(short *)puVar26 = (short)iVar19;
                  if (piVar37 == piVar17) {
                    puVar14 = (ulong *)((lVar29 - (long)local_d0) + (long)puVar24);
                    if (puVar32 < puVar14) {
                      puVar14 = puVar32;
                    }
                    puVar6 = (ulong *)((long)puVar24 + 4);
                    puVar15 = (ulong *)((long)local_d0 + 4);
                    puVar16 = puVar6;
                    puVar41 = puVar15;
                    if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d0 + 4);
                      uVar43 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      uVar43 = uVar43 >> 3 & 0x1fffffff;
                      puVar16 = (ulong *)((long)puVar24 + 0xc);
                      puVar41 = (ulong *)((long)local_d0 + 0xc);
                      if (*(ulong *)((long)local_d0 + 4) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_0011166f;
                    }
                    else {
LAB_0011166f:
                      do {
                        puVar15 = puVar41;
                        if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                          if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                             ((int)*puVar15 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar15 = (ulong *)((long)puVar15 + 4);
                          }
                          if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                             ((short)*puVar15 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar15 = (ulong *)((long)puVar15 + 2);
                          }
                          if (puVar16 < puVar14) {
                            uVar43 = *puVar15;
                            puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar43);
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)uVar43 == (char)*puVar16));
                          }
                          uVar43 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                          goto LAB_001116aa;
                        }
                        uVar43 = *puVar15;
                        uVar4 = *puVar16;
                        uVar35 = uVar4 ^ uVar43;
                        uVar40 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar16;
                        puVar15 = puVar15 + 1;
                        puVar16 = puVar16 + 1;
                        puVar41 = puVar15;
                      } while (uVar43 == uVar4);
                      uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                    }
LAB_001116aa:
                    uVar20 = (uint)uVar43;
                    puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                    if (puVar24 == puVar14) {
                      puVar16 = puVar14;
                      puVar6 = (ulong *)source;
                      if (puVar14 < puVar5) {
                        uVar43 = *(ulong *)source;
                        uVar4 = *puVar14;
                        uVar40 = 0;
                        if ((uVar4 ^ uVar43) != 0) {
                          for (; ((uVar4 ^ uVar43) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                        uVar13 = (uint)puVar15;
                        if (uVar43 == uVar4) {
                          puVar6 = (ulong *)(source + (ulong)(uVar43 == uVar4) * 8);
                          puVar16 = puVar14 + (uVar43 == uVar4);
                          goto LAB_0011171b;
                        }
                      }
                      else {
LAB_0011171b:
                        do {
                          if (puVar5 <= puVar16) {
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                               ((int)*puVar6 == (int)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 4);
                              puVar6 = (ulong *)((long)puVar6 + 4);
                            }
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                               ((short)*puVar6 == (short)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 2);
                              puVar6 = (ulong *)((long)puVar6 + 2);
                            }
                            if (puVar16 < puVar32) {
                              puVar16 = (ulong *)((long)puVar16 +
                                                 (ulong)((char)*puVar6 == (char)*puVar16));
                            }
                            uVar13 = (int)puVar16 - (int)puVar14;
                            break;
                          }
                          uVar43 = *puVar6;
                          uVar40 = *puVar16 ^ uVar43;
                          uVar4 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                            }
                          }
                          puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                          puVar6 = puVar6 + 1;
                          bVar49 = uVar43 == *puVar16;
                          puVar16 = puVar16 + 1;
                          if (!bVar49) {
                            puVar16 = puVar41;
                          }
                          puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                          if (!bVar49) {
                            puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                          }
                          uVar13 = (uint)puVar15;
                        } while (bVar49);
                      }
                      uVar20 = uVar20 + uVar13;
                      puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                    }
                  }
                  else {
                    puVar14 = (ulong *)((long)puVar24 + 4);
                    puVar6 = (ulong *)((long)local_d0 + 4);
                    puVar15 = puVar14;
                    if (puVar14 < puVar5) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d0 + 4);
                      uVar43 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      uVar43 = uVar43 >> 3 & 0x1fffffff;
                      puVar15 = (ulong *)((long)puVar24 + 0xc);
                      puVar6 = (ulong *)((long)local_d0 + 0xc);
                      if (*(ulong *)((long)local_d0 + 4) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_001115bd;
                    }
                    else {
LAB_001115bd:
                      do {
                        if (puVar5 <= puVar15) {
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar6 == (int)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 4);
                            puVar6 = (ulong *)((long)puVar6 + 4);
                          }
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar6 == (short)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 2);
                            puVar6 = (ulong *)((long)puVar6 + 2);
                          }
                          if (puVar15 < puVar32) {
                            puVar15 = (ulong *)((long)puVar15 +
                                               (ulong)((char)*puVar6 == (char)*puVar15));
                          }
                          uVar43 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                          goto LAB_001115f8;
                        }
                        uVar43 = *puVar6;
                        uVar4 = *puVar15;
                        uVar35 = uVar4 ^ uVar43;
                        uVar40 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar15;
                        puVar6 = puVar6 + 1;
                        puVar15 = puVar15 + 1;
                      } while (uVar43 == uVar4);
                      uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar14)
                      ;
                    }
LAB_001115f8:
                    uVar20 = (uint)uVar43;
                    puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                  }
                  puVar6 = (ulong *)((long)puVar26 + 2);
                  pcVar22 = (char *)((long)puVar26 + (ulong)(uVar20 + 0xf0) / 0xff + 8);
                  if (pcVar22 <= pcVar30) {
                    if (uVar20 < 0xf) {
                      *(char *)local_c8 = (char)*local_c8 + (char)uVar20;
                    }
                    else {
                      *(char *)local_c8 = (char)*local_c8 + '\x0f';
                      uVar13 = uVar20 - 0xf;
                      *(undefined4 *)puVar6 = 0xffffffff;
                      if (0x3fb < uVar13) {
                        uVar20 = uVar20 - 0x40b;
                        memset((char *)((long)puVar26 + 6),0xff,(ulong)((uVar20 / 0x3fc) * 4 + 4));
                        uVar13 = uVar20 % 0x3fc;
                        puVar6 = (ulong *)((long)puVar26 + (ulong)((uVar20 / 0x3fc) * 4) + 6);
                      }
                      pcVar44 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                      puVar6 = (ulong *)(pcVar44 + 1);
                      *pcVar44 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                    }
                  }
                  puVar14 = puVar24;
                  puVar26 = puVar6;
                  if (pcVar30 < pcVar22) {
                    iVar12 = 1;
                    goto LAB_00111a54;
                  }
                  local_e8 = puVar24;
                  if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                    iVar12 = 3;
                    goto LAB_00111a54;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)puVar24 + -2) - iVar25;
                  uVar43 = *puVar24 * -0x30e4432345000000 >> 0x34;
                  uVar13 = (int)puVar24 - iVar25;
                  uVar20 = *(uint *)((long)LZ4_stream + uVar43 * 4);
                  lVar1 = lVar39;
                  if (uVar20 < uVar10) {
                    lVar1 = lVar46;
                  }
                  local_d0 = (long *)((ulong)uVar20 + lVar1);
                  piVar37 = (int *)source;
                  if (uVar20 < uVar10) {
                    piVar37 = piVar17;
                  }
                  *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar13;
                  bVar49 = true;
                  if ((uVar13 <= uVar20 + 0xffff) && (*(int *)local_d0 == (int)*puVar24)) {
                    *(char *)puVar6 = '\0';
                    iVar19 = uVar13 - uVar20;
                    bVar49 = false;
                    puVar26 = (ulong *)((long)puVar6 + 1);
                    local_c8 = puVar6;
                  }
                } while (!bVar49);
                uVar42 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
                iVar12 = 0;
                puVar14 = (ulong *)((long)puVar24 + 1);
              }
            }
LAB_00111a54:
            local_c8 = puVar26;
          } while (iVar12 == 0);
          dest = (char *)local_c8;
          if (1 < iVar12 - 2U) goto LAB_001122e4;
        }
        pcVar44 = source + ((ulong)(uint)inputSize - (long)local_e8);
        pcVar22 = (char *)((long)dest + (long)(pcVar44 + (ulong)(pcVar44 + 0xf0) / 0xff + 1));
        if (pcVar22 <= pcVar30) {
          if (pcVar44 < (char *)0xf) {
            *dest = (char)pcVar44 << 4;
          }
          else {
            pcVar7 = pcVar44 + -0xf;
            *dest = -0x10;
            puVar32 = (ulong *)((long)dest + 1);
            if ((char *)0xfe < pcVar7) {
              uVar42 = (ulong)(pcVar44 + -0x10e) / 0xff;
              memset(puVar32,0xff,uVar42 + 1);
              puVar32 = (ulong *)((long)dest + uVar42 + 2);
              pcVar7 = pcVar44 + uVar42 * -0xff + -0x10e;
            }
            *(char *)puVar32 = (char)pcVar7;
            dest = (char *)puVar32;
          }
          memcpy((char *)((long)dest + 1),local_e8,(size_t)pcVar44);
          dest = (char *)((long)dest + (long)(pcVar44 + 1));
        }
        iVar21 = 0;
        if (pcVar22 <= pcVar30) {
          iVar21 = (int)dest - iVar47;
        }
        goto LAB_00110910;
      }
LAB_00111a79:
      iVar21 = 0;
      if (0 < maxOutputSize) {
        *dest = '\0';
        iVar21 = 1;
      }
      goto LAB_00110910;
    }
  }
  else if (inputSize < 0x1001) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar20 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar17 = (int *)__src->dictionary;
        uVar10 = __src->currentOffset;
        lVar29 = (ulong)__src->dictSize + (long)piVar17;
        lVar46 = lVar29 - (ulong)uVar10;
        if (piVar17 == (int *)0x0) {
          lVar46 = 0;
        }
        pcVar30 = dest + maxOutputSize;
        LZ4_stream->table[0x802] = (void *)0x0;
        (LZ4_stream->internal_donotuse).dictSize = inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar20 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < inputSize) {
          lVar39 = (long)source - (ulong)uVar20;
          iVar19 = uVar20 - uVar10;
          puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar17 == (int *)0x0) {
            lVar29 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar20;
          puVar14 = (ulong *)(source + 1);
          uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar5 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
          iVar25 = 0;
          local_f8 = (ulong *)dest;
          local_88 = (int *)source;
          do {
            uVar13 = 1;
            uVar10 = iVar21 << 6;
            while( true ) {
              puVar26 = (ulong *)((ulong)uVar13 + (long)puVar14);
              iVar23 = (int)puVar14;
              iVar12 = (int)lVar39;
              if (source + ((ulong)(uint)inputSize - 0xb) < puVar26) {
                iVar11 = 2;
              }
              else {
                uVar13 = *(uint *)((long)LZ4_stream + uVar42 * 4);
                if (uVar13 < uVar20) {
                  uVar13 = iVar19 + __src->hashTable[uVar42];
                  local_b8 = (int *)((ulong)__src->hashTable[uVar42] + lVar46);
                  local_88 = piVar17;
                }
                else {
                  local_b8 = (int *)(lVar39 + (ulong)uVar13);
                  local_88 = (int *)source;
                }
                uVar28 = iVar23 - iVar12;
                uVar43 = *puVar26 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_stream + uVar42 * 4) = uVar28;
                iVar11 = 8;
                uVar42 = uVar43;
                if (uVar28 <= uVar13 + 0xffff) {
                  if (*local_b8 == (int)*puVar14) {
                    iVar25 = uVar28 - uVar13;
                    iVar11 = 7;
                  }
                  else {
                    iVar11 = 0;
                  }
                }
              }
              if ((iVar11 != 0) && (iVar11 != 8)) break;
              uVar13 = uVar10 >> 6;
              uVar10 = uVar10 + 1;
              puVar14 = puVar26;
            }
            if (iVar11 == 7) {
              iVar11 = 0;
            }
            puVar26 = local_f8;
            if (iVar11 == 0) {
              uVar13 = iVar23 - (int)local_c0;
              lVar1 = 0;
              cVar2 = (char)puVar14 * '\x10' + (char)local_c0 * -0x10;
              uVar10 = uVar13 - 0xf;
              do {
                uVar28 = uVar10;
                cVar34 = cVar2;
                lVar38 = lVar1;
                piVar37 = (int *)((long)local_b8 + lVar38);
                puVar24 = (ulong *)(lVar38 + (long)puVar14);
                if ((piVar37 <= local_88) || (puVar24 <= local_c0)) break;
                lVar1 = lVar38 + -1;
                cVar2 = cVar34 + -0x10;
                uVar10 = uVar28 - 1;
              } while (*(char *)((long)puVar14 + lVar38 + -1) ==
                       *(char *)((long)local_b8 + lVar38 + -1));
              iVar11 = (int)lVar38;
              uVar43 = (ulong)(uint)((iVar23 - (int)local_c0) + iVar11);
              puVar26 = (ulong *)((long)local_f8 + 1);
              pcVar22 = (char *)((long)local_f8 +
                                ((ulong)uVar13 + lVar38 & 0xffffffff) / 0xff + uVar43 + 9);
              if (pcVar30 < pcVar22) {
                iVar11 = 1;
              }
              else {
                if ((uint)((ulong)uVar13 + lVar38) < 0xf) {
                  *(char *)local_f8 = cVar34;
                  puVar14 = puVar26;
                }
                else {
                  uVar4 = (ulong)(uVar13 - 0xf) + lVar38;
                  *(char *)local_f8 = -0x10;
                  if (0xfe < (int)uVar4) {
                    if (0x1fc < (int)uVar28) {
                      uVar28 = 0x1fd;
                    }
                    uVar10 = (uVar13 - uVar28) + iVar11 + 0xef;
                    memset(puVar26,0xff,(ulong)(uVar10 / 0xff + 1));
                    puVar26 = (ulong *)((long)local_f8 + (ulong)uVar10 / 0xff + 2);
                    uVar4 = (ulong)((uVar13 - 0x10e) + iVar11 + uVar10 / 0xff);
                  }
                  *(char *)puVar26 = (char)uVar4;
                  puVar14 = (ulong *)((long)puVar26 + 1);
                }
                puVar26 = (ulong *)(uVar43 + (long)puVar14);
                puVar6 = local_c0;
                do {
                  *puVar14 = *puVar6;
                  puVar14 = puVar14 + 1;
                  puVar6 = puVar6 + 1;
                } while (puVar14 < puVar26);
                iVar11 = 0;
              }
              puVar14 = puVar24;
              local_b8 = piVar37;
              if (pcVar22 <= pcVar30) {
                do {
                  *(short *)puVar26 = (short)iVar25;
                  if (local_88 == piVar17) {
                    puVar14 = (ulong *)((lVar29 - (long)local_b8) + (long)puVar24);
                    if (puVar32 < puVar14) {
                      puVar14 = puVar32;
                    }
                    puVar6 = (ulong *)((long)puVar24 + 4);
                    puVar15 = (ulong *)(local_b8 + 1);
                    puVar16 = puVar6;
                    puVar41 = puVar15;
                    if (puVar6 < (ulong *)((long)puVar14 - 7U)) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(local_b8 + 1);
                      uVar43 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      uVar43 = uVar43 >> 3 & 0x1fffffff;
                      puVar16 = (ulong *)((long)puVar24 + 0xc);
                      puVar41 = (ulong *)(local_b8 + 3);
                      if (*(ulong *)(local_b8 + 1) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_001104e8;
                    }
                    else {
LAB_001104e8:
                      do {
                        puVar15 = puVar41;
                        if ((ulong *)((long)puVar14 - 7U) <= puVar16) {
                          if ((puVar16 < (ulong *)((long)puVar14 - 3U)) &&
                             ((int)*puVar15 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar15 = (ulong *)((long)puVar15 + 4);
                          }
                          if ((puVar16 < (ulong *)((long)puVar14 - 1U)) &&
                             ((short)*puVar15 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar15 = (ulong *)((long)puVar15 + 2);
                          }
                          if (puVar16 < puVar14) {
                            uVar43 = *puVar15;
                            puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar43);
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)uVar43 == (char)*puVar16));
                          }
                          uVar43 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                          goto LAB_00110523;
                        }
                        uVar43 = *puVar15;
                        uVar4 = *puVar16;
                        uVar35 = uVar4 ^ uVar43;
                        uVar40 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar16;
                        puVar15 = puVar15 + 1;
                        puVar16 = puVar16 + 1;
                        puVar41 = puVar15;
                      } while (uVar43 == uVar4);
                      uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                    }
LAB_00110523:
                    uVar10 = (uint)uVar43;
                    puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                    if (puVar24 == puVar14) {
                      puVar16 = puVar14;
                      puVar6 = (ulong *)source;
                      if (puVar14 < puVar5) {
                        uVar43 = *(ulong *)source;
                        uVar4 = *puVar14;
                        uVar40 = 0;
                        if ((uVar4 ^ uVar43) != 0) {
                          for (; ((uVar4 ^ uVar43) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                        uVar13 = (uint)puVar15;
                        if (uVar43 == uVar4) {
                          puVar6 = (ulong *)(source + (ulong)(uVar43 == uVar4) * 8);
                          puVar16 = puVar14 + (uVar43 == uVar4);
                          goto LAB_00110588;
                        }
                      }
                      else {
LAB_00110588:
                        do {
                          if (puVar5 <= puVar16) {
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                               ((int)*puVar6 == (int)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 4);
                              puVar6 = (ulong *)((long)puVar6 + 4);
                            }
                            if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                               ((short)*puVar6 == (short)*puVar16)) {
                              puVar16 = (ulong *)((long)puVar16 + 2);
                              puVar6 = (ulong *)((long)puVar6 + 2);
                            }
                            if (puVar16 < puVar32) {
                              puVar16 = (ulong *)((long)puVar16 +
                                                 (ulong)((char)*puVar6 == (char)*puVar16));
                            }
                            uVar13 = (int)puVar16 - (int)puVar14;
                            break;
                          }
                          uVar43 = *puVar6;
                          uVar40 = *puVar16 ^ uVar43;
                          uVar4 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                            }
                          }
                          puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                          puVar6 = puVar6 + 1;
                          bVar49 = uVar43 == *puVar16;
                          puVar16 = puVar16 + 1;
                          if (!bVar49) {
                            puVar16 = puVar41;
                          }
                          puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                          if (!bVar49) {
                            puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar14);
                          }
                          uVar13 = (uint)puVar15;
                        } while (bVar49);
                      }
                      uVar10 = uVar10 + uVar13;
                      puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                    }
                  }
                  else {
                    puVar14 = (ulong *)((long)puVar24 + 4);
                    puVar6 = (ulong *)(local_b8 + 1);
                    puVar15 = puVar14;
                    if (puVar14 < puVar5) {
                      uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)(local_b8 + 1);
                      uVar43 = 0;
                      if (uVar4 != 0) {
                        for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      uVar43 = uVar43 >> 3 & 0x1fffffff;
                      puVar15 = (ulong *)((long)puVar24 + 0xc);
                      puVar6 = (ulong *)(local_b8 + 3);
                      if (*(ulong *)(local_b8 + 1) == *(ulong *)((long)puVar24 + 4))
                      goto LAB_0011043b;
                    }
                    else {
LAB_0011043b:
                      do {
                        if (puVar5 <= puVar15) {
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                             ((int)*puVar6 == (int)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 4);
                            puVar6 = (ulong *)((long)puVar6 + 4);
                          }
                          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                             ((short)*puVar6 == (short)*puVar15)) {
                            puVar15 = (ulong *)((long)puVar15 + 2);
                            puVar6 = (ulong *)((long)puVar6 + 2);
                          }
                          if (puVar15 < puVar32) {
                            puVar15 = (ulong *)((long)puVar15 +
                                               (ulong)((char)*puVar6 == (char)*puVar15));
                          }
                          uVar43 = (ulong)(uint)((int)puVar15 - (int)puVar14);
                          goto LAB_00110476;
                        }
                        uVar43 = *puVar6;
                        uVar4 = *puVar15;
                        uVar35 = uVar4 ^ uVar43;
                        uVar40 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                          }
                        }
                        iVar23 = (int)puVar15;
                        puVar6 = puVar6 + 1;
                        puVar15 = puVar15 + 1;
                      } while (uVar43 == uVar4);
                      uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar14)
                      ;
                    }
LAB_00110476:
                    uVar10 = (uint)uVar43;
                    puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                  }
                  puVar6 = (ulong *)((long)puVar26 + 2);
                  pcVar22 = (char *)((long)puVar26 + (ulong)(uVar10 + 0xf0) / 0xff + 8);
                  if (pcVar22 <= pcVar30) {
                    if (uVar10 < 0xf) {
                      *(char *)local_f8 = (char)*local_f8 + (char)uVar10;
                    }
                    else {
                      *(char *)local_f8 = (char)*local_f8 + '\x0f';
                      uVar13 = uVar10 - 0xf;
                      *(undefined4 *)puVar6 = 0xffffffff;
                      if (0x3fb < uVar13) {
                        uVar10 = uVar10 - 0x40b;
                        memset((char *)((long)puVar26 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                        uVar13 = uVar10 % 0x3fc;
                        puVar6 = (ulong *)((long)puVar26 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                      }
                      pcVar44 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                      puVar6 = (ulong *)(pcVar44 + 1);
                      *pcVar44 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                    }
                  }
                  puVar14 = puVar24;
                  puVar26 = puVar6;
                  if (pcVar30 < pcVar22) {
                    iVar11 = 1;
                    goto LAB_001108cf;
                  }
                  local_c0 = puVar24;
                  if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                    iVar11 = 3;
                    goto LAB_001108cf;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)puVar24 + -2) - iVar12;
                  uVar43 = *puVar24 * -0x30e4432345000000 >> 0x34;
                  uVar10 = *(uint *)((long)LZ4_stream + uVar43 * 4);
                  if (uVar10 < uVar20) {
                    uVar10 = iVar19 + __src->hashTable[uVar43];
                    local_b8 = (int *)((ulong)__src->hashTable[uVar43] + lVar46);
                    local_88 = piVar17;
                  }
                  else {
                    local_b8 = (int *)(lVar39 + (ulong)uVar10);
                    local_88 = (int *)source;
                  }
                  uVar13 = (int)puVar24 - iVar12;
                  *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar13;
                  bVar49 = true;
                  if ((uVar13 <= uVar10 + 0xffff) && (*local_b8 == (int)*puVar24)) {
                    *(char *)puVar6 = '\0';
                    iVar25 = uVar13 - uVar10;
                    bVar49 = false;
                    puVar26 = (ulong *)((long)puVar6 + 1);
                    local_f8 = puVar6;
                  }
                } while (!bVar49);
                uVar42 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
                iVar11 = 0;
                puVar14 = (ulong *)((long)puVar24 + 1);
              }
            }
LAB_001108cf:
            local_f8 = puVar26;
          } while (iVar11 == 0);
          dest = (char *)local_f8;
          if (1 < iVar11 - 2U) goto LAB_001122e4;
        }
        pcVar22 = source + ((ulong)(uint)inputSize - (long)local_c0);
        pcVar44 = (char *)((long)dest + (long)(pcVar22 + (ulong)(pcVar22 + 0xf0) / 0xff + 1));
        if (pcVar44 <= pcVar30) {
          if (pcVar22 < (char *)0xf) {
            *dest = (char)pcVar22 << 4;
          }
          else {
            pcVar7 = pcVar22 + -0xf;
            *dest = -0x10;
            puVar32 = (ulong *)((long)dest + 1);
            if ((char *)0xfe < pcVar7) {
              uVar42 = (ulong)(pcVar22 + -0x10e) / 0xff;
              memset((ulong *)((long)dest + 1),0xff,uVar42 + 1);
              pcVar7 = pcVar22 + uVar42 * -0xff + -0x10e;
              puVar32 = (ulong *)((long)dest + uVar42 + 2);
            }
            dest = (char *)puVar32;
            *dest = (char)pcVar7;
          }
          memcpy((char *)((long)dest + 1),local_c0,(size_t)pcVar22);
          dest = (char *)((long)dest + (long)(pcVar22 + 1));
        }
        iVar21 = 0;
        if (pcVar44 <= pcVar30) {
          iVar21 = (int)dest - iVar47;
        }
        goto LAB_00110910;
      }
      goto LAB_00111a79;
    }
  }
  else {
    memcpy(LZ4_stream,__src,0x4020);
    if ((uint)inputSize < 0x7e000001) {
      uVar20 = (LZ4_stream->internal_donotuse).currentOffset;
      lVar39 = (long)source - (ulong)uVar20;
      piVar17 = (int *)(LZ4_stream->internal_donotuse).dictionary;
      lVar46 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar17;
      lVar29 = lVar46 - (ulong)uVar20;
      if (piVar17 == (int *)0x0) {
        lVar46 = 0;
      }
      puVar32 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
      if (piVar17 == (int *)0x0) {
        lVar29 = 0;
      }
      pcVar30 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize =
           inputSize + (LZ4_stream->internal_donotuse).dictSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar20 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar20;
      puVar5 = (ulong *)(source + 1);
      uVar42 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      puVar14 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
      iVar19 = 0;
      piVar37 = (int *)source;
      local_d8 = (ulong *)dest;
      do {
        uVar13 = 1;
        uVar10 = iVar21 << 6;
        while( true ) {
          puVar26 = (ulong *)((ulong)uVar13 + (long)puVar5);
          iVar23 = (int)puVar5;
          iVar25 = (int)lVar39;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar26) {
            iVar12 = 2;
          }
          else {
            uVar28 = iVar23 - iVar25;
            uVar13 = *(uint *)((long)LZ4_stream + uVar42 * 4);
            lVar1 = lVar39;
            if (uVar13 < uVar20) {
              lVar1 = lVar29;
            }
            local_d0 = (long *)(lVar1 + (ulong)uVar13);
            piVar37 = (int *)source;
            if (uVar13 < uVar20) {
              piVar37 = piVar17;
            }
            uVar43 = *puVar26 * -0x30e4432345000000 >> 0x34;
            *(uint *)((long)LZ4_stream + uVar42 * 4) = uVar28;
            iVar12 = 8;
            uVar42 = uVar43;
            if (uVar28 <= uVar13 + 0xffff) {
              if (*(int *)local_d0 == (int)*puVar5) {
                iVar19 = uVar28 - uVar13;
                iVar12 = 7;
              }
              else {
                iVar12 = 0;
              }
            }
          }
          if ((iVar12 != 0) && (iVar12 != 8)) break;
          uVar13 = uVar10 >> 6;
          uVar10 = uVar10 + 1;
          puVar5 = puVar26;
        }
        if (iVar12 == 7) {
          iVar12 = 0;
        }
        puVar26 = local_d8;
        if (iVar12 == 0) {
          uVar13 = iVar23 - (int)local_e8;
          lVar1 = 0;
          cVar2 = (char)puVar5 * '\x10' + (char)local_e8 * -0x10;
          uVar10 = uVar13 - 0xf;
          do {
            uVar28 = uVar10;
            cVar34 = cVar2;
            lVar38 = lVar1;
            piVar48 = (int *)((long)local_d0 + lVar38);
            puVar24 = (ulong *)(lVar38 + (long)puVar5);
            if ((piVar48 <= piVar37) || (puVar24 <= local_e8)) break;
            lVar1 = lVar38 + -1;
            cVar2 = cVar34 + -0x10;
            uVar10 = uVar28 - 1;
          } while (*(char *)((long)puVar5 + lVar38 + -1) == *(char *)((long)local_d0 + lVar38 + -1))
          ;
          iVar12 = (int)lVar38;
          uVar43 = (ulong)(uint)((iVar23 - (int)local_e8) + iVar12);
          puVar26 = (ulong *)((long)local_d8 + 1);
          pcVar22 = (char *)((long)local_d8 +
                            ((ulong)uVar13 + lVar38 & 0xffffffff) / 0xff + uVar43 + 9);
          if (pcVar30 < pcVar22) {
            iVar12 = 1;
          }
          else {
            if ((uint)((ulong)uVar13 + lVar38) < 0xf) {
              *(char *)local_d8 = cVar34;
              puVar5 = puVar26;
            }
            else {
              uVar4 = (ulong)(uVar13 - 0xf) + lVar38;
              *(char *)local_d8 = -0x10;
              if (0xfe < (int)uVar4) {
                if (0x1fc < (int)uVar28) {
                  uVar28 = 0x1fd;
                }
                uVar10 = (uVar13 - uVar28) + iVar12 + 0xef;
                uVar4 = (ulong)uVar10 / 0xff;
                memset(puVar26,0xff,(ulong)(uVar10 / 0xff + 1));
                puVar26 = (ulong *)((long)local_d8 + uVar4 + 2);
                uVar4 = (ulong)((uVar13 - 0x10e) + iVar12 + (int)uVar4 * -0xff);
              }
              *(char *)puVar26 = (char)uVar4;
              puVar5 = (ulong *)((long)puVar26 + 1);
            }
            puVar26 = (ulong *)(uVar43 + (long)puVar5);
            puVar6 = local_e8;
            do {
              *puVar5 = *puVar6;
              puVar5 = puVar5 + 1;
              puVar6 = puVar6 + 1;
            } while (puVar5 < puVar26);
            iVar12 = 0;
          }
          puVar5 = puVar24;
          local_d0 = (long *)piVar48;
          if (pcVar22 <= pcVar30) {
            do {
              *(short *)puVar26 = (short)iVar19;
              if (piVar37 == piVar17) {
                puVar5 = (ulong *)((lVar46 - (long)local_d0) + (long)puVar24);
                if (puVar32 < puVar5) {
                  puVar5 = puVar32;
                }
                puVar6 = (ulong *)((long)puVar24 + 4);
                puVar15 = (ulong *)((long)local_d0 + 4);
                puVar16 = puVar6;
                puVar41 = puVar15;
                if (puVar6 < (ulong *)((long)puVar5 - 7U)) {
                  uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d0 + 4);
                  uVar43 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  uVar43 = uVar43 >> 3 & 0x1fffffff;
                  puVar16 = (ulong *)((long)puVar24 + 0xc);
                  puVar41 = (ulong *)((long)local_d0 + 0xc);
                  if (*(ulong *)((long)local_d0 + 4) == *(ulong *)((long)puVar24 + 4))
                  goto LAB_00110d9c;
                }
                else {
LAB_00110d9c:
                  do {
                    puVar15 = puVar41;
                    if ((ulong *)((long)puVar5 - 7U) <= puVar16) {
                      if ((puVar16 < (ulong *)((long)puVar5 - 3U)) &&
                         ((int)*puVar15 == (int)*puVar16)) {
                        puVar16 = (ulong *)((long)puVar16 + 4);
                        puVar15 = (ulong *)((long)puVar15 + 4);
                      }
                      if ((puVar16 < (ulong *)((long)puVar5 - 1U)) &&
                         ((short)*puVar15 == (short)*puVar16)) {
                        puVar16 = (ulong *)((long)puVar16 + 2);
                        puVar15 = (ulong *)((long)puVar15 + 2);
                      }
                      if (puVar16 < puVar5) {
                        uVar43 = *puVar15;
                        puVar15 = (ulong *)CONCAT71((int7)((ulong)puVar15 >> 8),(char)uVar43);
                        puVar16 = (ulong *)((long)puVar16 + (ulong)((char)uVar43 == (char)*puVar16))
                        ;
                      }
                      uVar43 = (ulong)(uint)((int)puVar16 - (int)puVar6);
                      goto LAB_00110dd7;
                    }
                    uVar43 = *puVar15;
                    uVar4 = *puVar16;
                    uVar35 = uVar4 ^ uVar43;
                    uVar40 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    iVar23 = (int)puVar16;
                    puVar15 = puVar15 + 1;
                    puVar16 = puVar16 + 1;
                    puVar41 = puVar15;
                  } while (uVar43 == uVar4);
                  uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar6);
                }
LAB_00110dd7:
                uVar10 = (uint)uVar43;
                puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
                if (puVar24 == puVar5) {
                  puVar16 = puVar5;
                  puVar6 = (ulong *)source;
                  if (puVar5 < puVar14) {
                    uVar43 = *(ulong *)source;
                    uVar4 = *puVar5;
                    uVar40 = 0;
                    if ((uVar4 ^ uVar43) != 0) {
                      for (; ((uVar4 ^ uVar43) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    puVar15 = (ulong *)(uVar40 >> 3 & 0x1fffffff);
                    uVar13 = (uint)puVar15;
                    if (uVar43 == uVar4) {
                      puVar6 = (ulong *)(source + (ulong)(uVar43 == uVar4) * 8);
                      puVar16 = puVar5 + (uVar43 == uVar4);
                      goto LAB_00110fd7;
                    }
                  }
                  else {
LAB_00110fd7:
                    do {
                      if (puVar14 <= puVar16) {
                        if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                           ((int)*puVar6 == (int)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 4);
                          puVar6 = (ulong *)((long)puVar6 + 4);
                        }
                        if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                           ((short)*puVar6 == (short)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 2);
                          puVar6 = (ulong *)((long)puVar6 + 2);
                        }
                        if (puVar16 < puVar32) {
                          puVar16 = (ulong *)((long)puVar16 +
                                             (ulong)((char)*puVar6 == (char)*puVar16));
                        }
                        uVar13 = (int)puVar16 - (int)puVar5;
                        break;
                      }
                      uVar43 = *puVar6;
                      uVar40 = *puVar16 ^ uVar43;
                      uVar4 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      puVar41 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                      puVar6 = puVar6 + 1;
                      bVar49 = uVar43 == *puVar16;
                      puVar16 = puVar16 + 1;
                      if (!bVar49) {
                        puVar16 = puVar41;
                      }
                      puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                      if (!bVar49) {
                        puVar15 = (ulong *)(ulong)(uint)((int)puVar41 - (int)puVar5);
                      }
                      uVar13 = (uint)puVar15;
                    } while (bVar49);
                  }
                  uVar10 = uVar10 + uVar13;
                  puVar24 = (ulong *)((long)puVar24 + (ulong)uVar13);
                }
              }
              else {
                puVar5 = (ulong *)((long)puVar24 + 4);
                puVar6 = (ulong *)((long)local_d0 + 4);
                puVar15 = puVar5;
                if (puVar5 < puVar14) {
                  uVar4 = *(ulong *)((long)puVar24 + 4) ^ *(ulong *)((long)local_d0 + 4);
                  uVar43 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  uVar43 = uVar43 >> 3 & 0x1fffffff;
                  puVar15 = (ulong *)((long)puVar24 + 0xc);
                  puVar6 = (ulong *)((long)local_d0 + 0xc);
                  if (*(ulong *)((long)local_d0 + 4) == *(ulong *)((long)puVar24 + 4))
                  goto LAB_00110cef;
                }
                else {
LAB_00110cef:
                  do {
                    if (puVar14 <= puVar15) {
                      if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                         ((int)*puVar6 == (int)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 4);
                        puVar6 = (ulong *)((long)puVar6 + 4);
                      }
                      if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                         ((short)*puVar6 == (short)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 2);
                        puVar6 = (ulong *)((long)puVar6 + 2);
                      }
                      if (puVar15 < puVar32) {
                        puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar6 == (char)*puVar15)
                                           );
                      }
                      uVar43 = (ulong)(uint)((int)puVar15 - (int)puVar5);
                      goto LAB_00110d2a;
                    }
                    uVar43 = *puVar6;
                    uVar4 = *puVar15;
                    uVar35 = uVar4 ^ uVar43;
                    uVar40 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    iVar23 = (int)puVar15;
                    puVar6 = puVar6 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar43 == uVar4);
                  uVar43 = (ulong)((((uint)(uVar40 >> 3) & 0x1fffffff) + iVar23) - (int)puVar5);
                }
LAB_00110d2a:
                uVar10 = (uint)uVar43;
                puVar24 = (ulong *)((long)puVar24 + uVar43 + 4);
              }
              puVar6 = (ulong *)((long)puVar26 + 2);
              pcVar22 = (char *)((long)puVar26 + (ulong)(uVar10 + 0xf0) / 0xff + 8);
              if (pcVar22 <= pcVar30) {
                if (uVar10 < 0xf) {
                  *(char *)local_d8 = (char)*local_d8 + (char)uVar10;
                }
                else {
                  *(char *)local_d8 = (char)*local_d8 + '\x0f';
                  uVar13 = uVar10 - 0xf;
                  *(undefined4 *)puVar6 = 0xffffffff;
                  if (0x3fb < uVar13) {
                    uVar10 = uVar10 - 0x40b;
                    memset((char *)((long)puVar26 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                    uVar13 = uVar10 % 0x3fc;
                    puVar6 = (ulong *)((long)puVar26 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                  }
                  pcVar44 = (char *)((long)puVar6 + (ulong)uVar13 / 0xff);
                  puVar6 = (ulong *)(pcVar44 + 1);
                  *pcVar44 = (char)((ulong)uVar13 * 0x8080808081 >> 0x27);
                }
              }
              puVar5 = puVar24;
              puVar26 = puVar6;
              if (pcVar30 < pcVar22) {
                iVar12 = 1;
                goto LAB_0011116a;
              }
              local_e8 = puVar24;
              if (source + ((ulong)(uint)inputSize - 0xb) <= puVar24) {
                iVar12 = 3;
                goto LAB_0011116a;
              }
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)puVar24 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)puVar24 + -2) - iVar25;
              uVar43 = *puVar24 * -0x30e4432345000000 >> 0x34;
              uVar13 = (int)puVar24 - iVar25;
              uVar10 = *(uint *)((long)LZ4_stream + uVar43 * 4);
              lVar1 = lVar39;
              if (uVar10 < uVar20) {
                lVar1 = lVar29;
              }
              local_d0 = (long *)((ulong)uVar10 + lVar1);
              piVar37 = (int *)source;
              if (uVar10 < uVar20) {
                piVar37 = piVar17;
              }
              *(uint *)((long)LZ4_stream + uVar43 * 4) = uVar13;
              bVar49 = true;
              if ((uVar13 <= uVar10 + 0xffff) && (*(int *)local_d0 == (int)*puVar24)) {
                *(char *)puVar6 = '\0';
                iVar19 = uVar13 - uVar10;
                bVar49 = false;
                puVar26 = (ulong *)((long)puVar6 + 1);
                local_d8 = puVar6;
              }
            } while (!bVar49);
            uVar42 = (ulong)(*(long *)((long)puVar24 + 1) * -0x30e4432345000000) >> 0x34;
            iVar12 = 0;
            puVar5 = (ulong *)((long)puVar24 + 1);
          }
        }
LAB_0011116a:
        local_d8 = puVar26;
      } while (iVar12 == 0);
      if (iVar12 - 2U < 2) {
        pcVar44 = source + ((ulong)(uint)inputSize - (long)local_e8);
        pcVar22 = (char *)((long)local_d8 + (long)(pcVar44 + (ulong)(pcVar44 + 0xf0) / 0xff + 1));
        if (pcVar22 <= pcVar30) {
          if (pcVar44 < (char *)0xf) {
            *(char *)local_d8 = (char)pcVar44 << 4;
          }
          else {
            pcVar7 = pcVar44 + -0xf;
            *(char *)local_d8 = -0x10;
            puVar32 = (ulong *)((long)local_d8 + 1);
            if ((char *)0xfe < pcVar7) {
              uVar42 = (ulong)(pcVar44 + -0x10e) / 0xff;
              memset(puVar32,0xff,uVar42 + 1);
              puVar32 = (ulong *)((long)local_d8 + uVar42 + 2);
              pcVar7 = pcVar44 + uVar42 * -0xff + -0x10e;
            }
            *(char *)puVar32 = (char)pcVar7;
            local_d8 = puVar32;
          }
          memcpy((char *)((long)local_d8 + 1),local_e8,(size_t)pcVar44);
          local_d8 = (ulong *)((long)local_d8 + (long)(pcVar44 + 1));
        }
        if (pcVar30 < pcVar22) {
          iVar21 = 0;
        }
        else {
          iVar21 = (int)local_d8 - iVar47;
        }
        goto LAB_00110910;
      }
LAB_001122e4:
      iVar21 = 0;
      goto LAB_00110910;
    }
  }
LAB_0011090b:
  iVar21 = 0;
LAB_00110910:
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar21;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}